

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvm.cpp
# Opt level: O0

Value * __thiscall Kvm::bindingsParameters(Kvm *this,Value *bindings)

{
  Value *pVVar1;
  undefined1 local_38 [8];
  GcGuard guard;
  Value *result;
  Value *bindings_local;
  Kvm *this_local;
  
  if (bindings == this->NIL) {
    this_local = (Kvm *)this->NIL;
  }
  else {
    guard.times_ = 0;
    GcGuard::GcGuard((GcGuard *)local_38,&this->gc_);
    GcGuard::pushLocalStackRoot((GcGuard *)local_38,(Value **)&guard.times_);
    pVVar1 = cdr(bindings);
    guard.times_ = (long)bindingsParameters(this,pVVar1);
    pVVar1 = car(bindings);
    pVVar1 = bindingParameter(this,pVVar1);
    this_local = (Kvm *)makeCell(this,pVVar1,(Value *)guard.times_);
    guard.times_ = (long)this_local;
    GcGuard::~GcGuard((GcGuard *)local_38);
  }
  return (Value *)this_local;
}

Assistant:

const Value* Kvm::bindingsParameters(const Value *bindings)
{
    if (bindings == NIL) return NIL;

    const Value *result = nullptr;
    GcGuard guard{gc_};
    guard.pushLocalStackRoot(&result);
    result = bindingsParameters(cdr(bindings));
    result = makeCell(bindingParameter(car(bindings)), result);
    return result;
}